

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O1

int deqp::gles31::Functional::anon_unknown_0::getIOSubVariableLocation
              (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
               *path,int startNdx,int currentLocation)

{
  Type TVar1;
  StructType *pSVar2;
  int iVar3;
  pointer pVVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  while( true ) {
    while( true ) {
      iVar5 = startNdx;
      if (currentLocation == -1) {
        return -1;
      }
      TVar1 = ((path->
               super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
               )._M_impl.super__Vector_impl_data._M_start[iVar5].m_data.type)->m_type;
      if (TVar1 != TYPE_ARRAY) break;
      startNdx = iVar5 + 1;
    }
    if (TVar1 == TYPE_BASIC) {
      return currentLocation;
    }
    if (TVar1 != TYPE_STRUCT) {
      return -1;
    }
    pVVar4 = (path->
             super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pSVar2 = ((pVVar4[iVar5].m_data.type)->m_data).structPtr;
    lVar6 = *(long *)&(pSVar2->m_members).
                      super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                      _M_impl;
    if ((int)((ulong)((long)*(pointer *)
                             ((long)&(pSVar2->m_members).
                                     super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                             + 8) - lVar6) >> 3) * -0x49249249 < 1) break;
    iVar7 = 0;
    lVar8 = 0x20;
    while (startNdx = iVar5 + 1, (VarType *)(lVar6 + lVar8) != pVVar4[iVar5 + 1].m_data.type) {
      iVar3 = -1;
      if (currentLocation != -1) {
        iVar3 = getVariableLocationLength((VarType *)(lVar6 + lVar8));
        iVar3 = iVar3 + currentLocation;
      }
      currentLocation = iVar3;
      iVar7 = iVar7 + 1;
      pVVar4 = (path->
               super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pSVar2 = ((pVVar4[iVar5].m_data.type)->m_data).structPtr;
      lVar6 = *(long *)&(pSVar2->m_members).
                        super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                        _M_impl;
      iVar3 = (int)((ulong)((long)*(pointer *)
                                   ((long)&(pSVar2->m_members).
                                           super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                   + 8) - lVar6) >> 3);
      lVar8 = lVar8 + 0x38;
      if (SBORROW4(iVar7,iVar3 * -0x49249249) == iVar7 + iVar3 * 0x49249249 < 0) {
        return -1;
      }
    }
  }
  return -1;
}

Assistant:

static int getIOSubVariableLocation (const std::vector<VariablePathComponent>& path, int startNdx, int currentLocation)
{
	if (currentLocation == -1)
		return -1;

	if (path[startNdx].getVariableType()->isBasicType())
		return currentLocation;
	else if (path[startNdx].getVariableType()->isArrayType())
		return getIOSubVariableLocation(path, startNdx+1, currentLocation);
	else if (path[startNdx].getVariableType()->isStructType())
	{
		for (int ndx = 0; ndx < path[startNdx].getVariableType()->getStructPtr()->getNumMembers(); ++ndx)
		{
			if (&path[startNdx].getVariableType()->getStructPtr()->getMember(ndx).getType() == path[startNdx + 1].getVariableType())
				return getIOSubVariableLocation(path, startNdx + 1, currentLocation);

			if (currentLocation != -1)
				currentLocation += getVariableLocationLength(path[startNdx].getVariableType()->getStructPtr()->getMember(ndx).getType());
		}

		// could not find member, never happens
		DE_ASSERT(false);
		return -1;
	}
	else
	{
		DE_ASSERT(false);
		return -1;
	}
}